

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O2

int Gia_ManSpeedupObj_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = Gia_ObjId(p,pObj);
  if (p->nTravIdsAlloc <= iVar2) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  piVar1 = p->pTravIds;
  iVar2 = Gia_ObjId(p,pObj);
  if (piVar1[iVar2] != p->nTravIds) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    uVar3 = (uint)*(undefined8 *)pObj;
    if ((~uVar3 & 0x9fffffff) == 0) {
      return 0;
    }
    if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSpeedup.c"
                    ,0x229,"int Gia_ManSpeedupObj_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    iVar2 = Gia_ManSpeedupObj_rec(p,pObj + -(ulong)(uVar3 & 0x1fffffff),vNodes);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = Gia_ManSpeedupObj_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vNodes);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = Gia_ObjId(p,pObj);
    Vec_IntPush(vNodes,iVar2);
  }
  return 1;
}

Assistant:

int Gia_ManSpeedupObj_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 1;
    Gia_ObjSetTravIdCurrent( p, pObj );
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    if ( !Gia_ManSpeedupObj_rec( p, Gia_ObjFanin0(pObj), vNodes ) )
        return 0;
    if ( !Gia_ManSpeedupObj_rec( p, Gia_ObjFanin1(pObj), vNodes ) )
        return 0;
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
    return 1;
}